

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mf_common.cpp
# Opt level: O2

double sum_cnt(vector<Triplet,_std::allocator<Triplet>_> *data_vec)

{
  pointer pTVar1;
  double *pdVar2;
  long lVar3;
  bool bVar4;
  double dVar5;
  
  pTVar1 = (data_vec->super__Vector_base<Triplet,_std::allocator<Triplet>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar3 = (long)(data_vec->super__Vector_base<Triplet,_std::allocator<Triplet>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pTVar1 >> 4;
  pdVar2 = &pTVar1->cnt;
  dVar5 = 0.0;
  while (bVar4 = lVar3 != 0, lVar3 = lVar3 + -1, bVar4) {
    dVar5 = dVar5 + *pdVar2;
    pdVar2 = pdVar2 + 2;
  }
  return dVar5;
}

Assistant:

double sum_cnt(vector<Triplet> &data_vec) {
    double sum = 0;
    for (int i = 0; i < data_vec.size(); i++) {
        sum += data_vec[i].cnt;
    }
    return sum;
}